

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_errors.h
# Opt level: O0

void __thiscall
RigidBodyDynamics::Errors::RBDLFileParseError::~RBDLFileParseError(RBDLFileParseError *this)

{
  void *in_RDI;
  
  ~RBDLFileParseError((RBDLFileParseError *)0x6da528);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

class RBDL_DLLAPI RBDLFileParseError : public RBDLError
{
public:
  RBDLFileParseError(std::string text);
}